

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::HandleEnergyReport(CommissionerImpl *this,Request *aRequest)

{
  char cVar1;
  ErrorCode EVar2;
  char *pcVar3;
  Error *pEVar4;
  __shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ByteArray *pBVar6;
  char *pcVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  allocator local_189;
  mapped_type eneryListTlv;
  mapped_type channelMaskTlv;
  ByteArray energyList;
  ChannelMask channelMask;
  writer write;
  string local_c8;
  Error error;
  string peerAddr;
  TlvSet tlvSet;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tlvSet._M_t._M_impl.super__Rb_tree_header._M_header;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  channelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  energyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  channelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  channelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  energyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  energyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (*aRequest->mEndpoint->_vptr_Endpoint[3])(&eneryListTlv);
  Address::ToString_abi_cxx11_(&peerAddr,(Address *)&eneryListTlv);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&eneryListTlv);
  std::__cxx11::string::string((string *)&channelMaskTlv,"mgmt",&local_189);
  eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(eneryListTlv.
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                _4_4_,0xd);
  eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_1562b5;
  pcVar3 = "received MGMT_ED_REPORT.ans from {}";
  write.handler_ =
       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)&eneryListTlv;
  while (pcVar3 != "") {
    cVar1 = *pcVar3;
    pcVar7 = pcVar3;
    while (cVar1 != '{') {
      pcVar7 = pcVar7 + 1;
      if (pcVar7 == "") {
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&write,pcVar3,"");
        goto LAB_00159a1b;
      }
      cVar1 = *pcVar7;
    }
    ::fmt::v10::detail::
    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::writer::operator()(&write,pcVar3,pcVar7);
    pcVar3 = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                       (pcVar7,"",
                        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&eneryListTlv);
  }
LAB_00159a1b:
  eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peerAddr._M_dataplus._M_p;
  eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peerAddr._M_string_length;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x23;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&eneryListTlv;
  ::fmt::v10::vformat_abi_cxx11_(&local_c8,(v10 *)"received MGMT_ED_REPORT.ans from {}",fmt,args);
  Log(kInfo,(string *)&channelMaskTlv,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&channelMaskTlv);
  ProxyClient::SendEmptyChanged(&this->mProxyClient,aRequest);
  tlv::GetTlvSet((Error *)&eneryListTlv,&tlvSet,&aRequest->mPayload,kMeshCoP);
  pEVar4 = Error::operator=(&error,(Error *)&eneryListTlv);
  EVar2 = pEVar4->mCode;
  std::__cxx11::string::~string
            ((string *)
             &eneryListTlv.
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  if (EVar2 == kNone) {
    eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT71(eneryListTlv.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                  _1_7_,0x35);
    p_Var5 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[](&tlvSet,(key_type *)&eneryListTlv)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&channelMaskTlv.
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,p_Var5);
    if ((Tlv *)CONCAT71(channelMaskTlv.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._1_7_,
                        channelMaskTlv.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._0_1_) != (Tlv *)0x0) {
      pBVar6 = tlv::Tlv::GetValue((Tlv *)CONCAT71(channelMaskTlv.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._1_7_,
                                                  channelMaskTlv.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_1_));
      DecodeChannelMask((Error *)&eneryListTlv,&channelMask,pBVar6);
      pEVar4 = Error::operator=(&error,(Error *)&eneryListTlv);
      EVar2 = pEVar4->mCode;
      std::__cxx11::string::~string
                ((string *)
                 &eneryListTlv.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (EVar2 != kNone) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&channelMaskTlv.
                    super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        goto LAB_00159bb0;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&channelMaskTlv.
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    channelMaskTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ._0_1_ = 0x39;
    p_Var5 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[](&tlvSet,(key_type *)&channelMaskTlv)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&eneryListTlv.
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,p_Var5);
    if (eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      pBVar6 = tlv::Tlv::GetValue(eneryListTlv.
                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&energyList,pBVar6);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&eneryListTlv.
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    (*this->mCommissionerHandler->_vptr_CommissionerHandler[5])
              (this->mCommissionerHandler,&peerAddr,&channelMask,&energyList);
  }
LAB_00159bb0:
  if (error.mCode != kNone) {
    std::__cxx11::string::string((string *)&channelMaskTlv,"mgmt",&local_189);
    eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0xd0000000d;
    eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_1562c1;
    pcVar3 = "handle MGMT_ED_REPORT.ans from {} failed: {}";
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&eneryListTlv;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar7 = pcVar3;
      while (cVar1 != '{') {
        pcVar7 = pcVar7 + 1;
        if (pcVar7 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)&write,pcVar3,"");
          goto LAB_00159c89;
        }
        cVar1 = *pcVar7;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()((writer *)&write,pcVar3,pcVar7);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                         (pcVar7,"",
                          (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&eneryListTlv);
    }
LAB_00159c89:
    Error::ToString_abi_cxx11_((string *)&write,&error);
    eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)peerAddr._M_dataplus._M_p;
    eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peerAddr._M_string_length;
    fmt_00.size_ = 0xdd;
    fmt_00.data_ = (char *)0x2c;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&eneryListTlv;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_c8,(v10 *)"handle MGMT_ED_REPORT.ans from {} failed: {}",fmt_00,args_00);
    Log(kWarn,(string *)&channelMaskTlv,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&write);
    std::__cxx11::string::~string((string *)&channelMaskTlv);
  }
  std::__cxx11::string::~string((string *)&peerAddr);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&energyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&channelMask);
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&tlvSet._M_t);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::HandleEnergyReport(const coap::Request &aRequest)
{
    Error       error;
    tlv::TlvSet tlvSet;
    ChannelMask channelMask;
    ByteArray   energyList;
    std::string peerAddr = aRequest.GetEndpoint()->GetPeerAddr().ToString();

    LOG_INFO(LOG_REGION_MGMT, "received MGMT_ED_REPORT.ans from {}", peerAddr);

    mProxyClient.SendEmptyChanged(aRequest);

    SuccessOrExit(error = GetTlvSet(tlvSet, aRequest));
    if (auto channelMaskTlv = tlvSet[tlv::Type::kChannelMask])
    {
        SuccessOrExit(error = DecodeChannelMask(channelMask, channelMaskTlv->GetValue()));
    }
    if (auto eneryListTlv = tlvSet[tlv::Type::kEnergyList])
    {
        energyList = eneryListTlv->GetValue();
    }

    mCommissionerHandler.OnEnergyReport(peerAddr, channelMask, energyList);

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_WARN(LOG_REGION_MGMT, "handle MGMT_ED_REPORT.ans from {} failed: {}", peerAddr, error.ToString());
    }
}